

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

Ref<embree::SceneGraph::PerspectiveCameraNode> __thiscall
embree::TutorialScene::getCamera(TutorialScene *this,string *name)

{
  pointer pcVar1;
  pointer __s2;
  PerspectiveCameraNode *pPVar2;
  pointer pRVar3;
  PerspectiveCameraNode *__n;
  int iVar4;
  runtime_error *this_00;
  long *plVar5;
  long *plVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  lVar7 = name->_M_string_length - (long)pcVar1;
  bVar10 = lVar7 != 0;
  if (bVar10) {
    uVar8 = lVar7 >> 3;
    __s2 = (in_RDX->_M_dataplus)._M_p;
    pPVar2 = (PerspectiveCameraNode *)in_RDX->_M_string_length;
    uVar9 = 1;
    do {
      pRVar3 = *(pointer *)(pcVar1 + uVar9 * 8 + -8);
      __n = pRVar3[7].ptr;
      if (__n == pPVar2) {
        if (__n != (PerspectiveCameraNode *)0x0) {
          iVar4 = bcmp(pRVar3[6].ptr,__s2,(size_t)__n);
          if (iVar4 != 0) goto LAB_0013af3a;
        }
        (this->cameras).
        super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pRVar3;
        if (pRVar3 != (pointer)0x0) {
          (*(code *)(pRVar3->ptr->super_Node).fileName._M_dataplus._M_p)(pRVar3);
        }
        if (bVar10) {
          return (Ref<embree::SceneGraph::PerspectiveCameraNode>)(PerspectiveCameraNode *)this;
        }
        break;
      }
LAB_0013af3a:
      bVar10 = uVar9 < uVar8;
      lVar7 = (-(ulong)(uVar8 == 0) - uVar8) + uVar9;
      uVar9 = uVar9 + 1;
    } while (lVar7 != 0);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"camera \"",in_RDX);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70 = (long *)*plVar5;
  plVar6 = plVar5 + 2;
  if (local_70 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_70);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<SceneGraph::PerspectiveCameraNode> TutorialScene::getCamera(const std::string& name)
  {
    for (size_t i=0; i<cameras.size(); i++)
      if (cameras[i]->name == name) return cameras[i];
    
    THROW_RUNTIME_ERROR("camera \"" + name +"\" not found");
  }